

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O1

void PrintExceptionContinue(exception *pex,string_view thread_name)

{
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  char *local_70;
  char *local_68;
  char *pszModule;
  string message;
  FormatArg *local_38;
  char *local_30;
  FormatArg local_28;
  long local_10;
  
  local_30 = thread_name._M_str;
  local_38 = (FormatArg *)thread_name._M_len;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pszModule = "bitcoin";
  if (pex == (exception *)0x0) {
    tinyformat::format<char_const*,std::basic_string_view<char,std::char_traits<char>>>
              (&message,(tinyformat *)"UNKNOWN EXCEPTION       \n%s in %s       \n",
               (char *)&pszModule,(char **)&local_38,in_R8);
  }
  else {
    local_68 = *(char **)(*(long *)(*(long *)pex + -8) + 8);
    local_68 = local_68 + (*local_68 == '*');
    local_70 = (char *)(**(code **)(*(long *)pex + 0x10))();
    tinyformat::
    format<char_const*,char_const*,char_const*,std::basic_string_view<char,std::char_traits<char>>>
              (&message,(tinyformat *)"EXCEPTION: %s       \n%s       \n%s in %s       \n",
               (char *)&local_68,&local_70,&pszModule,(char **)&local_38,in_stack_ffffffffffffff88);
  }
  logging_function._M_str = "PrintExceptionContinue";
  logging_function._M_len = 0x16;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/exception.cpp"
  ;
  source_file._M_len = 0x62;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function,source_file,0x27,ALL,Info,(ConstevalFormatString<1U>)0x8815da,&message
            );
  local_38 = &local_28;
  local_30 = (char *)CONCAT44(local_30._4_4_,1);
  local_28.m_formatImpl = tinyformat::detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_28.m_toIntImpl = tinyformat::detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_28.m_value = &message;
  tinyformat::detail::formatImpl
            ((ostream *)&std::cerr,"\n\n************************\n%s\n",local_38,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)message._M_dataplus._M_p != &message.field_2) {
    operator_delete(message._M_dataplus._M_p,message.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PrintExceptionContinue(const std::exception* pex, std::string_view thread_name)
{
    std::string message = FormatException(pex, thread_name);
    LogPrintf("\n\n************************\n%s\n", message);
    tfm::format(std::cerr, "\n\n************************\n%s\n", message);
}